

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prop_down.h
# Opt level: O0

void __thiscall
mp::
ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::PropagateResult(ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *this,NotConstraint *con,double lb,double ub,Context ctx)

{
  bool bVar1;
  reference pvVar2;
  FunctionalConstraint *in_RSI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double unaff_retaddr;
  double in_stack_00000008;
  int in_stack_00000014;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_00000018;
  Context in_stack_00000024;
  double in_stack_00000058;
  double in_stack_00000060;
  int in_stack_0000006c;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_00000070;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  Context in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  Context local_4;
  
  FunctionalConstraint::GetResultVar(in_RSI);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::NarrowVarBounds(in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_00000058);
  FunctionalConstraint::AddContext
            ((FunctionalConstraint *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             in_stack_ffffffffffffffb4);
  if ((in_XMM0_Qa == in_XMM1_Qa) && (!NAN(in_XMM0_Qa) && !NAN(in_XMM1_Qa))) {
    if ((in_XMM0_Qa == 0.0) &&
       ((!NAN(in_XMM0_Qa) && (bVar1 = Context::HasNegative(&local_4), bVar1)))) {
      CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NotId>::GetArguments
                ((CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NotId> *)
                 (in_RSI + 1));
      pvVar2 = std::array<int,_1UL>::operator[]
                         ((array<int,_1UL> *)
                          CONCAT44(in_stack_ffffffffffffffb4.value_,in_stack_ffffffffffffffb0),
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      Context::operator-((Context *)CONCAT44(*pvVar2,in_stack_ffffffffffffffb8));
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::PropagateResultOfInitExpr
                (in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr,
                 in_stack_00000024);
      FunctionalConstraint::GetResultVar(in_RSI);
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::DecrementVarUsage((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                           *)CONCAT44(in_stack_ffffffffffffffb4.value_,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffac);
      return;
    }
    if (((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) &&
       (bVar1 = Context::HasPositive(&local_4), bVar1)) {
      CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NotId>::GetArguments
                ((CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NotId> *)
                 (in_RSI + 1));
      pvVar2 = std::array<int,_1UL>::operator[]
                         ((array<int,_1UL> *)
                          CONCAT44(in_stack_ffffffffffffffb4.value_,in_stack_ffffffffffffffb0),
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      Context::operator-((Context *)CONCAT44(in_stack_ffffffffffffffbc,*pvVar2));
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::PropagateResultOfInitExpr
                (in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr,
                 in_stack_00000024);
      FunctionalConstraint::GetResultVar(in_RSI);
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::DecrementVarUsage((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                           *)CONCAT44(in_stack_ffffffffffffffb4.value_,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffac);
      return;
    }
  }
  CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NotId>::GetArguments
            ((CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NotId> *)
             (in_RSI + 1));
  std::array<int,_1UL>::operator[]
            ((array<int,_1UL> *)CONCAT44(in_stack_ffffffffffffffb4.value_,in_stack_ffffffffffffffb0)
             ,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  Context::operator-((Context *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::PropagateResultOfInitExpr
            (in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr,in_stack_00000024);
  return;
}

Assistant:

void PropagateResult(NotConstraint& con, double lb, double ub, Context ctx) {
    MPD( NarrowVarBounds(con.GetResultVar(), lb, ub) );
    con.AddContext(ctx);
    if (lb==ub) {                         // result fixed
      if (!lb && ctx.HasNegative()) {       // result==0 && ctx-
        MPD( PropagateResultOfInitExpr(con.GetArguments()[0], 1.0, 1.0, -ctx) );
        MPD( DecrementVarUsage(con.GetResultVar()) );
        return;
      } else if (lb && ctx.HasPositive()) { // result==1 && ctx+
        MPD( PropagateResultOfInitExpr(con.GetArguments()[0], 0.0, 0.0, -ctx) );
        MPD( DecrementVarUsage(con.GetResultVar()) );
        return;
      }
    }
    MPD( PropagateResultOfInitExpr(con.GetArguments()[0], 0.0, 1.0, -ctx) );
  }